

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_paramhlp.c
# Opt level: O0

ParameterError
file2memory_range(char **bufp,size_t *size,FILE *file,curl_off_t starto,curl_off_t endo)

{
  int iVar1;
  CURLcode CVar2;
  size_t sVar3;
  char *pcVar4;
  size_t *local_1088;
  char *ptr_add;
  size_t n_add;
  char buffer [4096];
  size_t local_70;
  curl_off_t throwaway;
  curl_off_t offset;
  dynbuf dyn;
  size_t nread;
  curl_off_t endo_local;
  curl_off_t starto_local;
  FILE *file_local;
  size_t *size_local;
  char **bufp_local;
  
  if (file == (FILE *)0x0) {
    *size = 0;
    *bufp = (char *)0x0;
  }
  else {
    throwaway = 0;
    local_70 = 0;
    sVar3 = local_70;
    if (((starto != 0) && (sVar3 = starto, file != _stdin)) &&
       (iVar1 = myfseek(file,starto,0), sVar3 = local_70, throwaway = starto, iVar1 != 0)) {
      return PARAM_READ_ERROR;
    }
    local_70 = sVar3;
    curlx_dyn_init((dynbuf *)&offset,0x400000000);
    do {
      sVar3 = local_70;
      dyn.toobig = fread(&n_add,1,0x1000,(FILE *)file);
      iVar1 = ferror((FILE *)file);
      if (iVar1 != 0) {
        curlx_dyn_free((dynbuf *)&offset);
        *size = 0;
        *bufp = (char *)0x0;
        return PARAM_READ_ERROR;
      }
      ptr_add = (char *)dyn.toobig;
      local_1088 = &n_add;
      if (dyn.toobig != 0) {
        if (local_70 != 0) {
          if ((long)local_70 < (long)dyn.toobig) {
            ptr_add = (char *)(dyn.toobig - local_70);
            local_1088 = (size_t *)(buffer + (local_70 - 8));
            local_70 = 0;
          }
          else {
            local_70 = local_70 - dyn.toobig;
            ptr_add = (char *)0x0;
            sVar3 = dyn.toobig;
          }
          throwaway = sVar3 + throwaway;
        }
        if (ptr_add != (char *)0x0) {
          if (endo < (long)(ptr_add + throwaway)) {
            ptr_add = (char *)((endo - throwaway) + 1);
          }
          CVar2 = curlx_dyn_addn((dynbuf *)&offset,local_1088,(size_t)ptr_add);
          if (CVar2 != CURLE_OK) {
            return PARAM_NO_MEM;
          }
          throwaway = (curl_off_t)(ptr_add + throwaway);
          if (endo < throwaway) break;
        }
      }
      iVar1 = feof((FILE *)file);
    } while (iVar1 == 0);
    sVar3 = curlx_dyn_len((dynbuf *)&offset);
    *size = sVar3;
    pcVar4 = curlx_dyn_ptr((dynbuf *)&offset);
    *bufp = pcVar4;
  }
  return PARAM_OK;
}

Assistant:

ParameterError file2memory_range(char **bufp, size_t *size, FILE *file,
                                 curl_off_t starto, curl_off_t endo)
{
  if(file) {
    size_t nread;
    struct curlx_dynbuf dyn;
    curl_off_t offset = 0;
    curl_off_t throwaway = 0;

    if(starto) {
      if(file != stdin) {
        if(myfseek(file, starto, SEEK_SET))
          return PARAM_READ_ERROR;
        offset = starto;
      }
      else
        /* we can't seek stdin, read 'starto' bytes and throw them away */
        throwaway = starto;
    }

    /* The size needs to fit in an int later */
    curlx_dyn_init(&dyn, MAX_FILE2MEMORY);
    do {
      char buffer[4096];
      size_t n_add;
      char *ptr_add;
      nread = fread(buffer, 1, sizeof(buffer), file);
      if(ferror(file)) {
        curlx_dyn_free(&dyn);
        *size = 0;
        *bufp = NULL;
        return PARAM_READ_ERROR;
      }
      n_add = nread;
      ptr_add = buffer;
      if(nread) {
        if(throwaway) {
          if(throwaway >= (curl_off_t)nread) {
            throwaway -= nread;
            offset += nread;
            n_add = 0; /* nothing to add */
          }
          else {
            /* append the trailing piece */
            n_add = (size_t)(nread - throwaway);
            ptr_add = &buffer[throwaway];
            offset += throwaway;
            throwaway = 0;
          }
        }
        if(n_add) {
          if((curl_off_t)(n_add + offset) > endo)
            n_add = (size_t)(endo - offset + 1);

          if(curlx_dyn_addn(&dyn, ptr_add, n_add))
            return PARAM_NO_MEM;

          offset += n_add;
          if(offset > endo)
            break;
        }
      }
    } while(!feof(file));
    *size = curlx_dyn_len(&dyn);
    *bufp = curlx_dyn_ptr(&dyn);
  }
  else {
    *size = 0;
    *bufp = NULL;
  }
  return PARAM_OK;
}